

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

int SSE4x4_SSE2(uint8_t *a,uint8_t *b)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __m128i a23s;
  __m128i a01s;
  __m128i b23;
  __m128i b01;
  __m128i a23;
  __m128i a01;
  __m128i b3;
  __m128i b2;
  __m128i b1;
  __m128i b0;
  __m128i a3;
  __m128i a2;
  __m128i a1;
  __m128i a0;
  __m128i zero;
  int local_2a8;
  int iStack_2a4;
  int iStack_2a0;
  int iStack_29c;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  byte local_178;
  undefined1 uStack_177;
  undefined1 uStack_176;
  undefined1 uStack_175;
  byte bStack_174;
  undefined1 uStack_173;
  undefined1 uStack_172;
  undefined1 uStack_171;
  byte local_158;
  undefined1 uStack_157;
  undefined1 uStack_156;
  undefined1 uStack_155;
  byte bStack_154;
  undefined1 uStack_153;
  undefined1 uStack_152;
  undefined1 uStack_151;
  byte local_138;
  undefined1 uStack_137;
  undefined1 uStack_136;
  undefined1 uStack_135;
  byte bStack_134;
  undefined1 uStack_133;
  undefined1 uStack_132;
  undefined1 uStack_131;
  byte local_118;
  undefined1 uStack_117;
  undefined1 uStack_116;
  undefined1 uStack_115;
  byte bStack_114;
  undefined1 uStack_113;
  undefined1 uStack_112;
  undefined1 uStack_111;
  int32_t tmp [4];
  __m128i sum;
  __m128i e1;
  __m128i e0;
  __m128i d1;
  __m128i d0;
  __m128i b23s;
  __m128i b01s;
  
  uVar1 = *in_RDI;
  uVar2 = in_RDI[4];
  uVar3 = in_RDI[8];
  uVar4 = in_RDI[0xc];
  uVar5 = *in_RSI;
  uVar6 = in_RSI[4];
  uVar7 = in_RSI[8];
  uVar8 = in_RSI[0xc];
  local_118 = (byte)uVar1;
  uStack_117 = (undefined1)((ulong)uVar1 >> 8);
  uStack_116 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_115 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_114 = (byte)uVar2;
  uStack_113 = (undefined1)((ulong)uVar2 >> 8);
  uStack_112 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_111 = (undefined1)((ulong)uVar2 >> 0x18);
  local_138 = (byte)uVar3;
  uStack_137 = (undefined1)((ulong)uVar3 >> 8);
  uStack_136 = (undefined1)((ulong)uVar3 >> 0x10);
  uStack_135 = (undefined1)((ulong)uVar3 >> 0x18);
  bStack_134 = (byte)uVar4;
  uStack_133 = (undefined1)((ulong)uVar4 >> 8);
  uStack_132 = (undefined1)((ulong)uVar4 >> 0x10);
  uStack_131 = (undefined1)((ulong)uVar4 >> 0x18);
  local_158 = (byte)uVar5;
  uStack_157 = (undefined1)((ulong)uVar5 >> 8);
  uStack_156 = (undefined1)((ulong)uVar5 >> 0x10);
  uStack_155 = (undefined1)((ulong)uVar5 >> 0x18);
  bStack_154 = (byte)uVar6;
  uStack_153 = (undefined1)((ulong)uVar6 >> 8);
  uStack_152 = (undefined1)((ulong)uVar6 >> 0x10);
  uStack_151 = (undefined1)((ulong)uVar6 >> 0x18);
  local_178 = (byte)uVar7;
  uStack_177 = (undefined1)((ulong)uVar7 >> 8);
  uStack_176 = (undefined1)((ulong)uVar7 >> 0x10);
  uStack_175 = (undefined1)((ulong)uVar7 >> 0x18);
  bStack_174 = (byte)uVar8;
  uStack_173 = (undefined1)((ulong)uVar8 >> 8);
  uStack_172 = (undefined1)((ulong)uVar8 >> 0x10);
  uStack_171 = (undefined1)((ulong)uVar8 >> 0x18);
  auVar9[1] = 0;
  auVar9[0] = local_118;
  auVar9[2] = uStack_117;
  auVar9[3] = 0;
  auVar9[4] = uStack_116;
  auVar9[5] = 0;
  auVar9[6] = uStack_115;
  auVar9[7] = 0;
  auVar9[9] = 0;
  auVar9[8] = bStack_114;
  auVar9[10] = uStack_113;
  auVar9[0xb] = 0;
  auVar9[0xc] = uStack_112;
  auVar9[0xd] = 0;
  auVar9[0xe] = uStack_111;
  auVar10[1] = 0;
  auVar10[0] = local_158;
  auVar10[2] = uStack_157;
  auVar10[3] = 0;
  auVar10[4] = uStack_156;
  auVar10[5] = 0;
  auVar10[6] = uStack_155;
  auVar10[7] = 0;
  auVar10[9] = 0;
  auVar10[8] = bStack_154;
  auVar10[10] = uStack_153;
  auVar10[0xb] = 0;
  auVar10[0xc] = uStack_152;
  auVar10[0xd] = 0;
  auVar10[0xe] = uStack_151;
  auVar9[0xf] = 0;
  auVar10[0xf] = 0;
  auVar10 = psubsw(auVar9,auVar10);
  auVar12[1] = 0;
  auVar12[0] = local_138;
  auVar12[2] = uStack_137;
  auVar12[3] = 0;
  auVar12[4] = uStack_136;
  auVar12[5] = 0;
  auVar12[6] = uStack_135;
  auVar12[7] = 0;
  auVar12[9] = 0;
  auVar12[8] = bStack_134;
  auVar12[10] = uStack_133;
  auVar12[0xb] = 0;
  auVar12[0xc] = uStack_132;
  auVar12[0xd] = 0;
  auVar12[0xe] = uStack_131;
  auVar11[1] = 0;
  auVar11[0] = local_178;
  auVar11[2] = uStack_177;
  auVar11[3] = 0;
  auVar11[4] = uStack_176;
  auVar11[5] = 0;
  auVar11[6] = uStack_175;
  auVar11[7] = 0;
  auVar11[9] = 0;
  auVar11[8] = bStack_174;
  auVar11[10] = uStack_173;
  auVar11[0xb] = 0;
  auVar11[0xc] = uStack_172;
  auVar11[0xd] = 0;
  auVar11[0xe] = uStack_171;
  auVar12[0xf] = 0;
  auVar11[0xf] = 0;
  auVar11 = psubsw(auVar12,auVar11);
  auVar12 = pmaddwd(auVar10,auVar10);
  auVar11 = pmaddwd(auVar11,auVar11);
  local_298 = auVar12._0_4_;
  iStack_294 = auVar12._4_4_;
  iStack_290 = auVar12._8_4_;
  iStack_28c = auVar12._12_4_;
  local_2a8 = auVar11._0_4_;
  iStack_2a4 = auVar11._4_4_;
  iStack_2a0 = auVar11._8_4_;
  iStack_29c = auVar11._12_4_;
  return iStack_28c + iStack_29c + iStack_290 + iStack_2a0 + iStack_294 + iStack_2a4 +
         local_298 + local_2a8;
}

Assistant:

static int SSE4x4_SSE2(const uint8_t* WEBP_RESTRICT a,
                       const uint8_t* WEBP_RESTRICT b) {
  const __m128i zero = _mm_setzero_si128();

  // Load values. Note that we read 8 pixels instead of 4,
  // but the a/b buffers are over-allocated to that effect.
  const __m128i a0 = _mm_loadl_epi64((const __m128i*)&a[BPS * 0]);
  const __m128i a1 = _mm_loadl_epi64((const __m128i*)&a[BPS * 1]);
  const __m128i a2 = _mm_loadl_epi64((const __m128i*)&a[BPS * 2]);
  const __m128i a3 = _mm_loadl_epi64((const __m128i*)&a[BPS * 3]);
  const __m128i b0 = _mm_loadl_epi64((const __m128i*)&b[BPS * 0]);
  const __m128i b1 = _mm_loadl_epi64((const __m128i*)&b[BPS * 1]);
  const __m128i b2 = _mm_loadl_epi64((const __m128i*)&b[BPS * 2]);
  const __m128i b3 = _mm_loadl_epi64((const __m128i*)&b[BPS * 3]);
  // Combine pair of lines.
  const __m128i a01 = _mm_unpacklo_epi32(a0, a1);
  const __m128i a23 = _mm_unpacklo_epi32(a2, a3);
  const __m128i b01 = _mm_unpacklo_epi32(b0, b1);
  const __m128i b23 = _mm_unpacklo_epi32(b2, b3);
  // Convert to 16b.
  const __m128i a01s = _mm_unpacklo_epi8(a01, zero);
  const __m128i a23s = _mm_unpacklo_epi8(a23, zero);
  const __m128i b01s = _mm_unpacklo_epi8(b01, zero);
  const __m128i b23s = _mm_unpacklo_epi8(b23, zero);
  // subtract, square and accumulate
  const __m128i d0 = _mm_subs_epi16(a01s, b01s);
  const __m128i d1 = _mm_subs_epi16(a23s, b23s);
  const __m128i e0 = _mm_madd_epi16(d0, d0);
  const __m128i e1 = _mm_madd_epi16(d1, d1);
  const __m128i sum = _mm_add_epi32(e0, e1);

  int32_t tmp[4];
  _mm_storeu_si128((__m128i*)tmp, sum);
  return (tmp[3] + tmp[2] + tmp[1] + tmp[0]);
}